

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

bool __thiscall
ON_OBSOLETE_V5_Annotation::IsValid(ON_OBSOLETE_V5_Annotation *this,ON_TextLog *text_log)

{
  bool bVar1;
  char *format;
  long lVar2;
  long lVar3;
  
  bVar1 = ON_Plane::IsValid(&this->m_plane);
  if (bVar1) {
    lVar3 = (long)(this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
    if (0 < lVar3) {
      lVar2 = 0;
      do {
        bVar1 = ON_2dPoint::IsValid((ON_2dPoint *)
                                    ((long)&((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a)
                                            ->x + lVar2));
        if (!bVar1) {
          if (text_log == (ON_TextLog *)0x0) {
            return false;
          }
          format = "ON_OBSOLETE_V5_Annotation - m_points[%d] is not valid.\n";
          goto LAB_004a281a;
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar3 * 0x10 != lVar2);
    }
    if ((byte)(this->m_type - dtDimLinear) < 8) {
      return true;
    }
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "ON_OBSOLETE_V5_Annotation - m_type = %d is not a valid enum value\n",
                        (ulong)this->m_type);
      return false;
    }
  }
  else if (text_log != (ON_TextLog *)0x0) {
    format = "ON_OBSOLETE_V5_Annotation - m_plane is not valid\n";
LAB_004a281a:
    ON_TextLog::Print(text_log,format);
    return false;
  }
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::IsValid( ON_TextLog* text_log ) const
{
  if ( !m_plane.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_Annotation - m_plane is not valid\n");
    }
    return false;
  }

  const int points_count = m_points.Count();

  int i;
  for ( i = 0; i < points_count; i++ )
  {
    if ( !m_points[i].IsValid() )
    {
      if ( text_log )
      {
        text_log->Print("ON_OBSOLETE_V5_Annotation - m_points[%d] is not valid.\n");
      }
      return false;
    }
  }

  switch ( m_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_Annotation - m_type = %d is not a valid enum value\n",m_type);
    }
    return false;
    break;
  }

  return true;
}